

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_module * lys_implemented_module(lys_module *mod)

{
  uint uVar1;
  lys_module *plVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (mod == (lys_module *)0x0) {
    return (lys_module *)0x0;
  }
  if (-1 < (char)mod->field_0x40) {
    uVar1 = (mod->ctx->models).used;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    while ((plVar2 = mod, uVar3 != uVar4 &&
           ((plVar2 = (mod->ctx->models).list[uVar4], -1 < (char)plVar2->field_0x40 ||
            (mod->name != plVar2->name))))) {
      uVar4 = uVar4 + 1;
    }
    return plVar2;
  }
  return mod;
}

Assistant:

lys_module *
lys_implemented_module(const struct lys_module *mod)
{
    struct ly_ctx *ctx;
    int i;

    if (!mod || mod->implemented) {
        /* invalid argument or the module itself is implemented */
        return (struct lys_module *)mod;
    }

    ctx = mod->ctx;
    for (i = 0; i < ctx->models.used; i++) {
        if (!ctx->models.list[i]->implemented) {
            continue;
        }

        if (ly_strequal(mod->name, ctx->models.list[i]->name, 1)) {
            /* we have some revision of the module implemented */
            return ctx->models.list[i];
        }
    }

    /* we have no revision of the module implemented, return the module itself,
     * it is up to the caller to set the module implemented when needed */
    return (struct lys_module *)mod;
}